

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotations.cpp
# Opt level: O3

void __thiscall
snestistics::AnnotationResolver::add_vector_comment
          (AnnotationResolver *this,RomAccessor *rom,char *comment,uint16_t target_at)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ushort *puVar4;
  undefined6 in_register_0000000a;
  value_type local_a8;
  
  puVar4 = (ushort *)RomAccessor::evalPtr(rom,(Pointer)CONCAT62(in_register_0000000a,target_at));
  paVar1 = &local_a8.name.field_2;
  local_a8.name._M_string_length = 0;
  local_a8.name.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_a8.comment.field_2;
  local_a8.comment._M_string_length = 0;
  local_a8.comment.field_2._M_local_buf[0] = '\0';
  local_a8.comment_is_multiline = false;
  paVar3 = &local_a8.useComment.field_2;
  local_a8.useComment._M_string_length = 0;
  local_a8.useComment.field_2._M_local_buf[0] = '\0';
  local_a8.type = ANNOTATION_LINE;
  local_a8.startOfRange = (Pointer)*puVar4;
  local_a8.name._M_dataplus._M_p = (pointer)paVar1;
  local_a8.comment._M_dataplus._M_p = (pointer)paVar2;
  local_a8.useComment._M_dataplus._M_p = (pointer)paVar3;
  local_a8.endOfRange = local_a8.startOfRange;
  strlen(comment);
  std::__cxx11::string::_M_replace((ulong)&local_a8.comment,0,(char *)0x0,(ulong)comment);
  local_a8.comment_is_multiline = false;
  std::vector<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>::push_back
            (&this->_annotations,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.useComment._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8.useComment._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.comment._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.comment._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void AnnotationResolver::add_vector_comment(const RomAccessor &rom, const char * const comment, const uint16_t target_at) {
	uint16_t target = *(uint16_t*)rom.evalPtr(target_at);
	Annotation a;
	a.type = ANNOTATION_LINE;
	a.startOfRange = a.endOfRange = target;
	a.comment = comment;
	a.comment_is_multiline = false;
	_annotations.push_back(a);
}